

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

void Imath_2_5::extractEulerXYZ<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  float fVar1;
  Matrix44<float> tmp;
  Vec3<float> local_118;
  Vec3<float> local_108;
  Vec3<float> local_f8;
  Matrix44<float> local_e8;
  Matrix44<float> local_a8;
  undefined1 local_68 [24];
  float local_50;
  float local_4c;
  Vec3<float> local_48;
  undefined8 local_3c;
  float afStack_34 [3];
  
  local_f8.z = mat->x[0][2];
  local_f8.x = *(float *)((long)(mat->x + 0) + 0);
  local_f8.y = *(float *)((long)(mat->x + 0) + 4);
  local_108.z = mat->x[1][2];
  local_108.x = *(float *)((long)(mat->x + 1) + 0);
  local_108.y = *(float *)((long)(mat->x + 1) + 4);
  local_118.z = mat->x[2][2];
  local_118.x = *(float *)((long)(mat->x + 2) + 0);
  local_118.y = *(float *)((long)(mat->x + 2) + 4);
  Vec3<float>::normalize(&local_f8);
  Vec3<float>::normalize(&local_108);
  Vec3<float>::normalize(&local_118);
  local_68._0_4_ = local_f8.x;
  local_68._4_4_ = local_f8.y;
  local_68._8_4_ = local_f8.z;
  local_68._12_4_ = 0.0;
  local_68._16_4_ = local_108.x;
  local_68._20_4_ = local_108.y;
  local_50 = local_108.z;
  local_4c = 0.0;
  local_48.x = local_118.x;
  local_48.y = local_118.y;
  local_48.z = local_118.z;
  local_3c._0_4_ = 0.0;
  local_3c._4_4_ = 0.0;
  afStack_34[0] = 0.0;
  afStack_34[1] = 0.0;
  afStack_34[2] = 1.0;
  local_a8.x[0][0] = atan2f(local_108.z,local_118.z);
  rot->x = local_a8.x[0][0];
  local_e8.x[0][2] = 0.0;
  local_e8.x[0][3] = 0.0;
  local_e8.x[1][2] = 0.0;
  local_e8.x[1][3] = 0.0;
  local_e8.x[2][0] = 0.0;
  local_e8.x[2][1] = 0.0;
  local_e8.x[3][0] = 0.0;
  local_e8.x[3][1] = 0.0;
  local_e8.x[0][0] = 1.0;
  local_e8.x[0][1] = 0.0;
  local_e8.x[1][0] = 0.0;
  local_e8.x[1][1] = 1.0;
  local_e8.x[2][2] = 1.0;
  local_e8.x[2][3] = 0.0;
  local_a8.x[0][0] = -local_a8.x[0][0];
  local_e8.x[3][2] = 0.0;
  local_e8.x[3][3] = 1.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  Matrix44<float>::rotate<float>(&local_e8,(Vec3<float> *)&local_a8);
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[2][2] = 0.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[0][0] = 0.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  Matrix44<float>::multiply(&local_e8,(Matrix44<float> *)local_68,&local_a8);
  local_e8.x[0][1] = local_a8.x[0][1];
  local_e8.x[0][0] = local_a8.x[0][0];
  local_e8.x[0][3] = local_a8.x[0][3];
  local_e8.x[0][2] = local_a8.x[0][2];
  local_e8.x[1][0] = local_a8.x[1][0];
  local_e8.x[1][1] = local_a8.x[1][1];
  local_e8.x[1][2] = local_a8.x[1][2];
  local_e8.x[1][3] = local_a8.x[1][3];
  local_e8.x[2][0] = local_a8.x[2][0];
  local_e8.x[2][1] = local_a8.x[2][1];
  local_e8.x[2][2] = local_a8.x[2][2];
  local_e8.x[2][3] = local_a8.x[2][3];
  local_e8.x[3][0] = local_a8.x[3][0];
  local_e8.x[3][1] = local_a8.x[3][1];
  local_e8.x[3][2] = local_a8.x[3][2];
  local_e8.x[3][3] = local_a8.x[3][3];
  fVar1 = local_a8.x[0][0] * local_a8.x[0][0] + local_a8.x[0][1] * local_a8.x[0][1];
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = atan2f(-local_e8.x[0][2],fVar1);
  rot->y = fVar1;
  fVar1 = atan2f(-local_e8.x[1][0],local_e8.x[1][1]);
  rot->z = fVar1;
  return;
}

Assistant:

void
extractEulerXYZ (const Matrix44<T> &mat, Vec3<T> &rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize();
    j.normalize();
    k.normalize();

    Matrix44<T> M (i[0], i[1], i[2], 0, 
		   j[0], j[1], j[2], 0, 
		   k[0], k[1], k[2], 0, 
		   0,    0,    0,    1);

    //
    // Extract the first angle, rot.x.
    // 

    rot.x = Math<T>::atan2 (M[1][2], M[2][2]);

    //
    // Remove the rot.x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (-rot.x, 0, 0));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy = Math<T>::sqrt (N[0][0]*N[0][0] + N[0][1]*N[0][1]);
    rot.y = Math<T>::atan2 (-N[0][2], cy);
    rot.z = Math<T>::atan2 (-N[1][0], N[1][1]);
}